

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint32_t do_mvcl(CPUS390XState_conflict *env,uint64_t *dest,uint64_t *destlen,uint64_t *src,
                uint64_t *srclen,uint16_t pad,int wordsize,uintptr_t ra)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  int iVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  ulong uVar7;
  int size;
  ulong uVar8;
  uint8_t local_90;
  S390Access local_80;
  S390Access local_58;
  
  iVar4 = cpu_mmu_index(env,SUB81(dest,0));
  uVar1 = *destlen;
  uVar2 = *srclen;
  uVar5 = 0;
  if (uVar1 != uVar2) {
    uVar5 = 2 - (uVar1 < uVar2);
  }
  uVar8 = -(*dest | 0xfffffffffffff000);
  if (uVar1 < uVar8) {
    uVar8 = uVar1;
  }
  if (uVar1 != 0) {
    if (uVar2 == 0) {
      size = (int)uVar8;
      if (wordsize == 1) {
        *destlen = uVar1 - uVar8;
        access_prepare(&local_80,env,*dest,size,MMU_DATA_STORE,iVar4,ra);
        local_90 = (uint8_t)pad;
        access_memset(env,&local_80,local_90,ra);
      }
      else {
        access_prepare(&local_80,env,*dest,size,MMU_DATA_STORE,iVar4,ra);
        for (iVar4 = 0; size != iVar4; iVar4 = iVar4 + 1) {
          uVar3 = pad >> 8;
          if ((*destlen & 1) != 0) {
            uVar3 = pad;
          }
          access_set_byte(env,&local_80,iVar4,(uint8_t)uVar3,ra);
          *destlen = *destlen - 1;
        }
      }
    }
    else {
      uVar7 = -(*src | 0xfffffffffffff000);
      if (uVar2 < -(*src | 0xfffffffffffff000)) {
        uVar7 = uVar2;
      }
      if (uVar7 < uVar8) {
        uVar8 = uVar7;
      }
      *destlen = uVar1 - uVar8;
      *srclen = *srclen - uVar8;
      access_prepare(&local_58,env,*src,(int)uVar8,MMU_DATA_LOAD,iVar4,ra);
      access_prepare(&local_80,env,*dest,(int)uVar8,MMU_DATA_STORE,iVar4,ra);
      access_memmove(env,&local_80,&local_58,ra);
      uVar6 = wrap_address(env,*src + uVar8);
      *src = uVar6;
    }
    uVar6 = wrap_address(env,uVar8 + *dest);
    *dest = uVar6;
    if (*destlen != 0) {
      uVar5 = 3;
    }
  }
  return uVar5;
}

Assistant:

static inline uint32_t do_mvcl(CPUS390XState *env,
                               uint64_t *dest, uint64_t *destlen,
                               uint64_t *src, uint64_t *srclen,
                               uint16_t pad, int wordsize, uintptr_t ra)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    int len = MIN(*destlen, -(*dest | TARGET_PAGE_MASK));
    S390Access srca, desta;
    int i, cc;

    if (*destlen == *srclen) {
        cc = 0;
    } else if (*destlen < *srclen) {
        cc = 1;
    } else {
        cc = 2;
    }

    if (!*destlen) {
        return cc;
    }

    /*
     * Only perform one type of type of operation (move/pad) at a time.
     * Stay within single pages.
     */
    if (*srclen) {
        /* Copy the src array */
        len = MIN(MIN(*srclen, -(*src | TARGET_PAGE_MASK)), len);
        *destlen -= len;
        *srclen -= len;
        srca = access_prepare(env, *src, len, MMU_DATA_LOAD, mmu_idx, ra);
        desta = access_prepare(env, *dest, len, MMU_DATA_STORE, mmu_idx, ra);
        access_memmove(env, &desta, &srca, ra);
        *src = wrap_address(env, *src + len);
        *dest = wrap_address(env, *dest + len);
    } else if (wordsize == 1) {
        /* Pad the remaining area */
        *destlen -= len;
        desta = access_prepare(env, *dest, len, MMU_DATA_STORE, mmu_idx, ra);
        access_memset(env, &desta, pad, ra);
        *dest = wrap_address(env, *dest + len);
    } else {
        desta = access_prepare(env, *dest, len, MMU_DATA_STORE, mmu_idx, ra);

        /* The remaining length selects the padding byte. */
        for (i = 0; i < len; (*destlen)--, i++) {
            if (*destlen & 1) {
                access_set_byte(env, &desta, i, pad, ra);
            } else {
                access_set_byte(env, &desta, i, pad >> 8, ra);
            }
        }
        *dest = wrap_address(env, *dest + len);
    }

    return *destlen ? 3 : cc;
}